

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O3

vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> * __thiscall
cfd::AddressFactory::GetAddressesFromMultisig
          (vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *__return_storage_ptr__,
          AddressFactory *this,AddressType address_type,Script *redeem_script,
          vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkey_list)

{
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters;
  CfdException *this_00;
  pointer pubkey;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *addr_list;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  Script script;
  Address addr;
  AddressType local_37c;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *local_378;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_370;
  Script local_358;
  Address local_320;
  undefined1 local_1a8 [32];
  char local_188 [16];
  pointer local_178;
  pointer local_160;
  pointer local_148;
  TapBranch local_130;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_37c = address_type;
  if ((kP2shP2wpkhAddress < address_type) || ((0x54U >> (address_type & 0x1f) & 1) == 0)) {
    local_1a8._0_8_ = "cfd_address.cpp";
    local_1a8._8_4_ = 0x130;
    local_1a8._16_8_ = (long)"CfdGetAddressesFromMultisig" + 3;
    core::logger::log<cfd::core::AddressType&>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,
               "Failed to GetAddressesFromMultisig. Invalid address_type passed:  addressType={}",
               &local_37c);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Invalid address_type. address_type must be \"p2pkh\" \"p2wpkh\" or \"p2sh-p2wpkh\"."
               ,"");
    core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::ScriptUtil::ExtractPubkeysFromMultisigScript(&local_370,redeem_script,(uint32_t *)0x0);
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::Address::Address((Address *)local_1a8);
  local_378 = pubkey_list;
  core::Script::Script(&local_358);
  if (local_370.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_370.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    network_parameters = &this->prefix_list_;
    pubkey = local_370.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      if (address_type == kP2shP2wpkhAddress) {
        core::ScriptUtil::CreateP2wpkhLockingScript((Script *)&local_320,pubkey);
        core::Script::operator=(&local_358,(Script *)&local_320);
        core::Script::~Script((Script *)&local_320);
        core::Address::Address(&local_320,this->type_,&local_358,network_parameters);
        core::Address::operator=((Address *)local_1a8,&local_320);
LAB_003a9a90:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_320.format_data_);
        core::Script::~Script(&local_320.redeem_script_);
        local_320.script_tree_.super_TapBranch._vptr_TapBranch =
             (_func_int **)&PTR__TaprootScriptTree_0072eb30;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_320.script_tree_.nodes_);
        core::TapBranch::~TapBranch(&local_320.script_tree_.super_TapBranch);
        if (local_320.schnorr_pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_320.schnorr_pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_320.pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_320.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_320.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_320.hash_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320.address_._M_dataplus._M_p != &local_320.address_.field_2) {
          operator_delete(local_320.address_._M_dataplus._M_p);
        }
      }
      else {
        if (address_type == kP2wpkhAddress) {
          core::Address::Address(&local_320,this->type_,kVersion0,pubkey,network_parameters);
          core::Address::operator=((Address *)local_1a8,&local_320);
          goto LAB_003a9a90;
        }
        if (address_type == kP2pkhAddress) {
          core::Address::Address(&local_320,this->type_,pubkey,network_parameters);
          core::Address::operator=((Address *)local_1a8,&local_320);
          goto LAB_003a9a90;
        }
      }
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
                (__return_storage_ptr__,(Address *)local_1a8);
      pubkey = pubkey + 1;
    } while (pubkey != local_370.
                       super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_378 != (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)0x0) {
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator=
              (local_378,&local_370);
  }
  core::Script::~Script(&local_358);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  core::Script::~Script(&local_a0);
  local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8);
  core::TapBranch::~TapBranch(&local_130);
  if (local_148 != (pointer)0x0) {
    operator_delete(local_148);
  }
  if (local_160 != (pointer)0x0) {
    operator_delete(local_160);
  }
  if (local_178 != (pointer)0x0) {
    operator_delete(local_178);
  }
  if ((char *)local_1a8._16_8_ != local_188) {
    operator_delete((void *)local_1a8._16_8_);
  }
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_370);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Address> AddressFactory::GetAddressesFromMultisig(
    AddressType address_type, const Script& redeem_script,
    std::vector<Pubkey>* pubkey_list) const {
  if ((address_type != AddressType::kP2pkhAddress) &&
      (address_type != AddressType::kP2wpkhAddress) &&
      (address_type != AddressType::kP2shP2wpkhAddress)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to GetAddressesFromMultisig. Invalid address_type passed:  "
        "addressType={}",  // NOLINT
        address_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid address_type. address_type must be \"p2pkh\" "
        "\"p2wpkh\" or \"p2sh-p2wpkh\".");  // NOLINT
  }

  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);

  std::vector<Address> addr_list;
  Address addr;
  Script script;
  for (const auto& pubkey : pubkeys) {
    if (address_type == AddressType::kP2pkhAddress) {
      addr = CreateP2pkhAddress(pubkey);
    } else if (address_type == AddressType::kP2shP2wpkhAddress) {
      script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
      addr = CreateP2shAddress(script);
    } else if (address_type == AddressType::kP2wpkhAddress) {
      // Currently we support only witness version 0.
      addr = CreateP2wpkhAddress(pubkey);
    }
    addr_list.push_back(addr);
  }

  if (pubkey_list) *pubkey_list = pubkeys;
  return addr_list;
}